

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

ssize_t phosg::readlink(char *__path,char *__buf,size_t __len)

{
  char *__path_00;
  char *__buf_00;
  size_type __len_00;
  size_type __n;
  cannot_stat_file *this;
  ssize_t length;
  allocator<char> local_1a;
  undefined1 local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *filename_local;
  string *data;
  
  local_19 = 0;
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf;
  filename_local = (string *)__path;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__path,0x400,'\0',&local_1a);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  __path_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              c_str(local_18);
  __buf_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path)
  ;
  __len_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path)
  ;
  __n = ::readlink(__path_00,__buf_00,__len_00);
  if (-1 < (long)__n) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path);
    return (ssize_t)__path;
  }
  this = (cannot_stat_file *)__cxa_allocate_exception(0x20);
  cannot_stat_file::cannot_stat_file(this,(string *)local_18);
  __cxa_throw(this,&cannot_stat_file::typeinfo,cannot_stat_file::~cannot_stat_file);
}

Assistant:

string readlink(const string& filename) {
  string data(1024, 0);
  ssize_t length = ::readlink(filename.c_str(), data.data(), data.size());
  if (length < 0) {
    throw cannot_stat_file(filename);
  }
  data.resize(length);
  data.shrink_to_fit();
  return data;
}